

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::WriteGltfStream(ostream *stream,string *content)

{
  byte bVar1;
  ostream *this;
  string *content_local;
  ostream *stream_local;
  
  this = std::operator<<(stream,(string *)content);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  bVar1 = std::ios::good();
  return (bool)(bVar1 & 1);
}

Assistant:

static bool WriteGltfStream(std::ostream &stream, const std::string &content) {
  stream << content << std::endl;
  return stream.good();
}